

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O1

void __thiscall
Future<void>::Private::ThreadPool::run(ThreadPool *this,_func_void_void_ptr *proc,void *args)

{
  usize *puVar1;
  usize uVar2;
  ulong uVar3;
  Item *pIVar4;
  ulong uVar5;
  ulong uVar6;
  ThreadContext *this_00;
  Node *pNVar7;
  ulong uVar8;
  Item *item;
  Item *pIVar9;
  Item *item_1;
  long lVar10;
  bool bVar11;
  Job job;
  
  while( true ) {
    uVar5 = (this->_queue)._tail;
    do {
      uVar6 = uVar5;
      pNVar7 = (this->_queue)._queue;
      uVar8 = (this->_queue)._capacityMask & uVar6;
      uVar3 = pNVar7[uVar8].tail;
      if (uVar3 != uVar6) goto LAB_00119836;
      puVar1 = &(this->_queue)._tail;
      LOCK();
      uVar5 = *puVar1;
      bVar11 = uVar6 == uVar5;
      if (bVar11) {
        *puVar1 = uVar6 + 1;
        uVar5 = uVar6;
      }
      UNLOCK();
    } while (!bVar11);
    pNVar7 = pNVar7 + uVar8;
    (pNVar7->data).proc = proc;
    (pNVar7->data).args = args;
    LOCK();
    pNVar7->head = uVar6;
    UNLOCK();
    if (uVar3 == uVar6) break;
LAB_00119836:
    LOCK();
    puVar1 = &(this->_dequeuedSignal)._state;
    uVar2 = *puVar1;
    *puVar1 = 0;
    UNLOCK();
    if (uVar2 == 1) {
      Signal::reset(&(this->_dequeuedSignal)._signal);
    }
    uVar5 = (this->_queue)._tail;
    do {
      uVar6 = uVar5;
      pNVar7 = (this->_queue)._queue;
      uVar8 = (this->_queue)._capacityMask & uVar6;
      uVar3 = pNVar7[uVar8].tail;
      if (uVar3 != uVar6) goto code_r0x0011988f;
      puVar1 = &(this->_queue)._tail;
      LOCK();
      uVar5 = *puVar1;
      bVar11 = uVar6 == uVar5;
      if (bVar11) {
        *puVar1 = uVar6 + 1;
        uVar5 = uVar6;
      }
      UNLOCK();
    } while (!bVar11);
    pNVar7 = pNVar7 + uVar8;
    (pNVar7->data).proc = proc;
    (pNVar7->data).args = args;
    LOCK();
    pNVar7->head = uVar6;
    UNLOCK();
    if (uVar3 == uVar6) break;
code_r0x0011988f:
    if ((this->_dequeuedSignal)._state == 0) {
      Signal::wait(&(this->_dequeuedSignal)._signal,(void *)(uVar8 * 0x20));
    }
  }
  LOCK();
  puVar1 = &(this->_enqueuedSignal)._state;
  uVar2 = *puVar1;
  *puVar1 = 1;
  UNLOCK();
  if (uVar2 == 0) {
    Signal::set(&(this->_enqueuedSignal)._signal);
  }
  LOCK();
  puVar1 = &this->_pushedJobs;
  uVar5 = *puVar1;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  uVar3 = this->_threadCount;
  lVar10 = ~uVar5 + this->_processedJobs + uVar3;
  if (lVar10 == 1) {
    uVar5 = Time::ticks();
    this->_idleResetTime = (uint32)(uVar5 >> 10);
  }
  else if (lVar10 < 1) {
    uVar5 = Time::ticks();
    this->_idleResetTime = (uint32)(uVar5 >> 10);
    if (uVar3 < this->_maxThreads) {
      Mutex::lock(&this->_mutex);
      pIVar4 = (this->_threads)._end.item;
      for (pIVar9 = (this->_threads)._begin.item; pIVar9 != pIVar4; pIVar9 = pIVar9->next) {
        if (*(char *)&pIVar9[3].prev == '\x01') {
          PoolList<Future<void>::Private::ThreadPool::ThreadContext>::remove
                    (&this->_threads,(char *)(pIVar9 + 1));
        }
      }
      if (this->_threadCount < this->_maxThreads) {
        this->_threadCount = this->_threadCount + 1;
        this_00 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::append
                            (&this->_threads);
      }
      else {
        this_00 = (ThreadContext *)0x0;
      }
      Mutex::unlock(&this->_mutex);
      if (this_00 != (ThreadContext *)0x0) {
        this_00->_pool = this;
        (this_00->_thread).func.c = &this_00->_thread;
        (this_00->_thread).func.a = (offset_in_Thread_to_subr)ThreadContext::proc;
        *(undefined8 *)&(this_00->_thread).func.field_0x10 = 0;
        bVar11 = Thread::start(&this_00->_thread,
                               Thread::
                               proc<Call<unsigned_int>::Member<Future<void>::Private::ThreadPool::ThreadContext>::Func0>
                               ,&(this_00->_thread).func);
        if (!bVar11) {
          this_00->_terminated = true;
        }
      }
    }
  }
  else if ((this->_minThreads < uVar3) &&
          (uVar5 = Time::ticks(), 1 < (int)(uVar5 >> 10) - this->_idleResetTime)) {
    Mutex::lock(&this->_mutex);
    if (this->_minThreads < this->_threadCount) {
      uVar5 = (this->_queue)._tail;
      do {
        uVar6 = uVar5;
        pNVar7 = (this->_queue)._queue;
        uVar8 = (this->_queue)._capacityMask & uVar6;
        uVar3 = pNVar7[uVar8].tail;
        if (uVar3 != uVar6) goto LAB_00119993;
        puVar1 = &(this->_queue)._tail;
        LOCK();
        uVar5 = *puVar1;
        bVar11 = uVar6 == uVar5;
        if (bVar11) {
          *puVar1 = uVar6 + 1;
          uVar5 = uVar6;
        }
        UNLOCK();
      } while (!bVar11);
      pNVar7 = pNVar7 + uVar8;
      (pNVar7->data).proc = (_func_void_void_ptr *)0x0;
      (pNVar7->data).args = (void *)0x0;
      LOCK();
      pNVar7->head = uVar6;
      UNLOCK();
      if (uVar3 == uVar6) {
        this->_threadCount = this->_threadCount - 1;
      }
    }
LAB_00119993:
    pIVar4 = (this->_threads)._end.item;
    pIVar9 = (this->_threads)._begin.item;
    if (pIVar9 != pIVar4) {
      do {
        if (*(char *)&pIVar9[3].prev == '\x01') {
          PoolList<Future<void>::Private::ThreadPool::ThreadContext>::remove
                    (&this->_threads,(char *)(pIVar9 + 1));
        }
        pIVar9 = pIVar9->next;
      } while (pIVar9 != pIVar4);
    }
    Mutex::unlock(&this->_mutex);
  }
  return;
}

Assistant:

void run(void (*proc)(void *), void *args)
    {
      Job job = {proc, args};
      while (!_queue.push(job))
      {
        _dequeuedSignal.reset();
        if (_queue.push(job))
          break;
        _dequeuedSignal.wait();
      }
      _enqueuedSignal.set();

      // adjust worker thread count
      usize pushedJobs = Atomic::increment(_pushedJobs);
      ssize busyThreads = (ssize)(pushedJobs - _processedJobs);
      usize threadCount = _threadCount;
      ssize idleThreads = (ssize)threadCount - busyThreads;
      if (idleThreads == 1)
        _idleResetTime = (uint32)(Time::ticks() >> 10);
      else
      {
        if (idleThreads <= 0)
        { // start new worker thread
          _idleResetTime = (uint32)(Time::ticks() >> 10);
          if (threadCount < _maxThreads)
          {
            ThreadContext *context = 0;
            {
              Mutex::Guard guard(_mutex);
              for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end;)
              {
                if (i->_terminated)
                  i = _threads.remove(i);
                else
                  ++i;
              }
              if (_threadCount < _maxThreads)
              {
                ++_threadCount;
                context = &_threads.append();
              }
            }
            if (context)
            {
              context->_pool = this;
              if (!context->_thread.start(*context, &ThreadContext::proc))
                context->_terminated = true;
            }
          }
        }
        else if (idleThreads > 1 && threadCount > _minThreads && (uint32)(Time::ticks() >> 10) - _idleResetTime > 1)
        { // terminate a worker thread
          Mutex::Guard guard(_mutex);
          if (_threadCount > _minThreads)
          {
            Job job = {0, 0};
            if (_queue.push(job))
              --_threadCount;
          }
          for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end;)
          {
            if (i->_terminated)
              i = _threads.remove(i);
            else
              ++i;
          }
        }
      }
    }